

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void check_analyze(string *str,bool has8bit,bool utf8,bool utf16)

{
  ostream *poVar1;
  void *this;
  bool local_16;
  bool local_15;
  bool local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  bool is_utf16;
  bool is_valid_utf8;
  bool has_8bit_chars;
  bool utf16_local;
  bool utf8_local;
  string *psStack_10;
  bool has8bit_local;
  string *str_local;
  
  local_14 = false;
  local_15 = false;
  local_16 = false;
  local_13 = utf16;
  local_12 = utf8;
  local_11 = has8bit;
  psStack_10 = str;
  QUtil::analyze_encoding(str,&local_14,&local_15,&local_16);
  if ((((local_14 & 1U) != (local_11 & 1)) || ((local_15 & 1U) != (local_12 & 1))) ||
     ((local_16 & 1U) != (local_13 & 1))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"analysis failed: ");
    poVar1 = std::operator<<(poVar1,(string *)psStack_10);
    poVar1 = std::operator<<(poVar1,": 8bit: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_14 & 1));
    poVar1 = std::operator<<(poVar1,", utf8: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(local_15 & 1));
    poVar1 = std::operator<<(poVar1,", utf16: ");
    this = (void *)std::ostream::operator<<(poVar1,(bool)(local_16 & 1));
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void
check_analyze(std::string const& str, bool has8bit, bool utf8, bool utf16)
{
    bool has_8bit_chars = false;
    bool is_valid_utf8 = false;
    bool is_utf16 = false;
    QUtil::analyze_encoding(str, has_8bit_chars, is_valid_utf8, is_utf16);
    if (!((has_8bit_chars == has8bit) && (is_valid_utf8 == utf8) && (is_utf16 == utf16))) {
        std::cout << "analysis failed: " << str << ": 8bit: " << has_8bit_chars
                  << ", utf8: " << is_valid_utf8 << ", utf16: " << is_utf16 << std::endl;
    }
}